

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,SequentialStmtBlock *stmt)

{
  unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
  *this_00;
  EventEdgeType EVar1;
  pointer pEVar2;
  Port *pPVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar4;
  mapped_type *pmVar5;
  VarException *pVVar6;
  __hash_code __code;
  ulong uVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar8;
  pointer pEVar9;
  bool bVar10;
  pair<std::__detail::_Node_iterator<std::pair<kratos::Port_*const,_bool>,_false,_false>,_bool>
  pVar11;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  Port *local_f0;
  SequentialStmtBlock *local_e8;
  Stmt *local_e0;
  undefined1 local_d8 [8];
  shared_ptr<kratos::Port> port_s;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [24];
  pointer local_88;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Port *local_40;
  element_type *port;
  
  pEVar9 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar9 != pEVar2) {
    this_00 = &this->reset_map_;
    local_50._M_allocated_capacity = (size_type)this;
    local_50._8_8_ = stmt;
    do {
      if (pEVar9->var->type_ == PortIO) {
        EVar1 = pEVar9->edge;
        Var::as<kratos::Port>((Var *)local_d8);
        local_40 = (Port *)local_d8;
        if (*(PortType *)((long)local_d8 + 0x274) == AsyncReset) {
          bVar10 = EVar1 == Posedge;
          if (((*(uint *)((long)local_d8 + 0x278) >> 8 & 1) != 0) &&
             (bVar10 != (bool)(char)*(uint *)((long)local_d8 + 0x278))) {
            pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
            (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_78);
            local_88 = (pointer)0x246b08;
            auStack_a0._8_8_ = "high";
            if (EVar1 == Posedge) {
              auStack_a0._8_8_ = "low";
              local_88 = (pointer)0x246ab0;
            }
            local_a8 = (undefined1  [8])
                       local_78.
                       super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            auStack_a0._0_8_ =
                 local_78.
                 super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            format_str_00.size_ = 0xccd;
            format_str_00.data_ = (char *)0x32;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_a8;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(detail *)"{0} is declared reset {1} but is used as reset {2}",
                       format_str_00,args_00);
            local_f0 = local_40;
            local_e8 = (SequentialStmtBlock *)local_50._8_8_;
            __l_00._M_len = 2;
            __l_00._M_array = (iterator)&local_f0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_a8,__l_00,(allocator_type *)((long)&port + 7));
            VarException::VarException
                      (pVVar6,(string *)
                              &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       local_a8);
            __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = (ulong)local_d8 % *(size_type *)(local_50._M_allocated_capacity + 0x50);
          aVar8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                      *)((((unordered_map<kratos::Port_*,_bool,_std::hash<kratos::Port_*>,_std::equal_to<kratos::Port_*>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>_>
                            *)(local_50._M_allocated_capacity + 0x48))->_M_h)._M_buckets + uVar7))->
                    values_;
          aVar4.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if ((aVar8.values_ !=
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) &&
             (in_R9.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar8.values_)->field_0).named_args.data, aVar4 = aVar8,
             aVar8.values_ = in_R9.values_,
             local_d8 != (undefined1  [8])((in_R9.values_)->field_0).string.size)) {
            while (in_R9.values_ =
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)((aVar8.values_)->field_0).named_args.data,
                  (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
              pPVar3 = (Port *)((in_R9.values_)->field_0).string.size;
              aVar4.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if (((ulong)pPVar3 % *(size_type *)(local_50._M_allocated_capacity + 0x50) != uVar7)
                 || (aVar4 = aVar8, aVar8.values_ = in_R9.values_,
                    local_d8 == (undefined1  [8])pPVar3)) goto LAB_001d30ff;
            }
            aVar4.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
          }
LAB_001d30ff:
          if ((aVar4.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) ||
             ((_Hash_node_base *)((aVar4.values_)->field_0).long_long_value ==
              (_Hash_node_base *)0x0)) {
            local_a8 = local_d8;
            auStack_a0[0] = bVar10;
            pVar11 = std::
                     _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<std::pair<kratos::Port*,bool>>
                               ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)this_00,local_a8);
            local_a8 = (undefined1  [8])local_40;
            auStack_a0._0_8_ = local_50._8_8_;
            std::
            _Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<kratos::Port*,kratos::SequentialStmtBlock*>>
                      ((_Hashtable<kratos::Port*,std::pair<kratos::Port*const,bool>,std::allocator<std::pair<kratos::Port*const,bool>>,std::__detail::_Select1st,std::equal_to<kratos::Port*>,std::hash<kratos::Port*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,local_a8,pVar11._8_8_);
          }
          else {
            pmVar5 = std::__detail::
                     _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_40);
            if (*pmVar5 != bVar10) {
              pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
              (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])
                        (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              local_78.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              format_str_01.size_ = 0xd;
              format_str_01.data_ = (char *)0x2a;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args_01.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&local_78;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)local_a8,(detail *)"Inconsistent active low/high usage for {0}",
                         format_str_01,args_01);
              local_f0 = local_40;
              local_e8 = (SequentialStmtBlock *)local_50._8_8_;
              local_e0 = get_reset_stmt((ActiveVisitor *)local_50._M_allocated_capacity,local_40);
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_f0;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_78,__l_01,(allocator_type *)((long)&port + 7));
              VarException::VarException(pVVar6,(string *)local_a8,&local_78);
              __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else if (*(PortType *)((long)local_d8 + 0x274) == Reset) {
          pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
          (*(local_40->super_Var).super_IRNode._vptr_IRNode[0x1f])
                    (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          local_78.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x36;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_a8,
                     (detail *)"{0} is used as async reset but is declared synchronous",format_str,
                     args);
          local_f0 = local_40;
          local_e8 = (SequentialStmtBlock *)local_50._8_8_;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_f0;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_78,__l,(allocator_type *)((long)&port + 7));
          VarException::VarException(pVVar6,(string *)local_a8,&local_78);
          __cxa_throw(pVVar6,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != pEVar2);
  }
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        auto const& sensitivity = stmt->get_event_controls();
        for (auto const& event : sensitivity) {
            auto t = event.edge;
            auto* v = event.var;
            if (v->type() == VarType::PortIO) {
                auto port_s = v->as<Port>();
                auto* port = port_s.get();
                if (port->port_type() == PortType::AsyncReset) {
                    auto reset_high = t == EventEdgeType::Posedge;
                    // check if we have reset edge set
                    if (port->active_high()) {
                        if (reset_high != (*port->active_high())) {
                            throw VarException(
                                ::format("{0} is declared reset {1} but is used as reset {2}",
                                         port->to_string(), reset_high ? "low" : "high",
                                         reset_high ? "high" : "low"),
                                {port, stmt});
                        }
                    }
                    if (reset_map_.find(port) != reset_map_.end()) {
                        // check consistency
                        if (reset_map_.at(port) != reset_high) {
                            throw VarException(
                                ::format("Inconsistent active low/high usage for {0}",
                                         port->to_string()),
                                {port, stmt, get_reset_stmt(port)});
                        }
                    } else {
                        reset_map_.emplace(std::make_pair(port, reset_high));
                        reset_map_.emplace(std::make_pair(port, stmt));
                    }
                } else if (port->port_type() == PortType::Reset) {
                    throw VarException(
                        ::format("{0} is used as async reset but is declared synchronous",
                                 port->to_string()),
                        {port, stmt});
                }
            }
        }
    }